

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O0

void __thiscall DListMenu::Ticker(DListMenu *this)

{
  uint uVar1;
  FListMenuItem **ppFVar2;
  uint local_14;
  uint i;
  DListMenu *this_local;
  
  DMenu::Ticker(&this->super_DMenu);
  local_14 = 0;
  while( true ) {
    uVar1 = TArray<FListMenuItem_*,_FListMenuItem_*>::Size
                      (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>);
    if (uVar1 <= local_14) break;
    ppFVar2 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                        (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>,
                         (ulong)local_14);
    (*(*ppFVar2)->_vptr_FListMenuItem[3])();
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void DListMenu::Ticker ()
{
	Super::Ticker();
	for(unsigned i=0;i<mDesc->mItems.Size(); i++)
	{
		mDesc->mItems[i]->Ticker();
	}
}